

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

void __thiscall
Js::JavascriptRegExp::JavascriptRegExp
          (JavascriptRegExp *this,JavascriptRegExp *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  RegexPattern *pRVar3;
  undefined4 *puVar4;
  void **ppvVar5;
  bool deepCopy_local;
  JavascriptRegExp *instance_local;
  JavascriptRegExp *this_local;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,&instance->super_DynamicObject,deepCopy);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e3c878;
  pRVar3 = GetPattern(instance);
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr(&this->pattern,pRVar3);
  pRVar3 = GetSplitPattern(instance);
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr(&this->splitPattern,pRVar3);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->lastIndexVar,&instance->lastIndexVar);
  this->lastIndexOrFlag = instance->lastIndexOrFlag;
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x42,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar3 = GetPattern(instance);
  bVar2 = ThreadContext::IsOnStack(pRVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x45,"(!ThreadContext::IsOnStack(instance->GetPattern()))",
                                "!ThreadContext::IsOnStack(instance->GetPattern())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar3 = GetSplitPattern(instance);
  bVar2 = ThreadContext::IsOnStack(pRVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x46,"(!ThreadContext::IsOnStack(instance->GetSplitPattern()))",
                                "!ThreadContext::IsOnStack(instance->GetSplitPattern())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&instance->lastIndexVar);
  bVar2 = ThreadContext::IsOnStack(*ppvVar5);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x47,"(!ThreadContext::IsOnStack(instance->lastIndexVar))",
                                "!ThreadContext::IsOnStack(instance->lastIndexVar)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

JavascriptRegExp::JavascriptRegExp(JavascriptRegExp * instance, bool deepCopy) :
        DynamicObject(instance, deepCopy),
        pattern(instance->GetPattern()),
        splitPattern(instance->GetSplitPattern()),
        lastIndexVar(instance->lastIndexVar),
        lastIndexOrFlag(instance->lastIndexOrFlag)
    {
        // For boxing stack instance
        Assert(ThreadContext::IsOnStack(instance));

        // These members should never be on the stack and thus never need to be deep copied
        Assert(!ThreadContext::IsOnStack(instance->GetPattern()));
        Assert(!ThreadContext::IsOnStack(instance->GetSplitPattern()));
        Assert(!ThreadContext::IsOnStack(instance->lastIndexVar));
    }